

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tun_linux.c
# Opt level: O0

_Bool if_setaddr(char *ifname,in_addr addr)

{
  int iVar1;
  undefined4 in_ESI;
  char *in_RDI;
  _Bool success;
  sockaddr_in *a;
  ifreq r;
  int fd;
  char local_40 [16];
  undefined2 local_30;
  undefined4 local_2c;
  int local_14;
  char *local_10;
  undefined4 local_8;
  _Bool local_1;
  
  local_10 = in_RDI;
  local_8 = in_ESI;
  local_14 = socket(2,2,0);
  if (local_14 == -1) {
    local_1 = false;
  }
  else {
    memset(local_40,0,0x28);
    strncpy(local_40,local_10,0x10);
    local_30 = 2;
    local_2c = local_8;
    iVar1 = ioctl(local_14,0x8916,local_40);
    close(local_14);
    local_1 = iVar1 != -1;
  }
  return local_1;
}

Assistant:

static bool if_setaddr(const char * ifname, struct in_addr addr)
{
  int fd = socket(AF_INET, SOCK_DGRAM, 0);
  if(fd == -1) return false;
  struct ifreq r;
  memset(&r, 0, sizeof(struct ifreq));
  strncpy(r.ifr_name, ifname, sizeof(r.ifr_name));
  struct sockaddr_in * a = (struct sockaddr_in * ) &r.ifr_addr;
  a->sin_family = AF_INET;
  memcpy(&a->sin_addr, &addr, sizeof(struct in_addr));
  bool success = ioctl(fd, SIOCSIFADDR, &r) != -1;
  close(fd);
  return success;
}